

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::reserve
          (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
           *this,size_t minSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  PossibleFunction *pPVar3;
  ulong uVar4;
  undefined8 uVar5;
  PossibleFunction *pPVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (this->numAllocated < minSize) {
    uVar8 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar8 != 0) {
      pPVar6 = (PossibleFunction *)operator_new__(uVar8 << 4);
      pPVar3 = this->items;
      uVar4 = this->numActive;
      lVar7 = 0;
      for (uVar9 = 0; uVar9 < uVar4; uVar9 = uVar9 + 1) {
        puVar1 = (undefined8 *)((long)&pPVar3->function + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pPVar6->function + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar7 = lVar7 + 0x10;
      }
      freeIfHeapAllocated(this);
      this->items = pPVar6;
    }
    this->numAllocated = uVar8;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }